

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::LeftoverBuffer::append
          (LeftoverBuffer *this,string_view from)

{
  uint uVar1;
  Nonnull<const_char_*> pcVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long v1;
  
  uVar4 = from._M_len;
  v1 = this->size + uVar4;
  if (v1 < 5) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,4,"size + from.size() <= kUtfMax");
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (uVar4 < 4) {
      uVar1 = this->size;
      if (uVar4 != 0) {
        uVar3 = 0;
        do {
          this->buffer[uVar3 + uVar1] = from._M_str[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      this->size = (int)from._M_len + uVar1;
      return;
    }
  }
  else {
    _GLOBAL__N_1::LeftoverBuffer::append();
  }
  protobuf_assumption_failed
            ("size < 4",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
             ,0xe4);
}

Assistant:

void LeftoverBuffer::append(absl::string_view from) {
  ABSL_DCHECK_LE(size + from.size(), kUtfMax);

  UnrolledMemcpy(buffer + size, from.data(), from.size());
  size += from.size();
}